

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

string * tinyusdz::detail::to_xml_string<tinyusdz::value::color3f>
                   (string *__return_storage_ptr__,color3f *val)

{
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dtos_abi_cxx11_(&local_f0,(double)val->r);
  ::std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                   ", ");
  dtos_abi_cxx11_(&local_90,(double)val->g);
  ::std::operator+(&local_70,&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  ::std::operator+(&local_50,&local_70,", ");
  dtos_abi_cxx11_(&local_b0,(double)val->b);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string to_xml_string(const value::color3f &val) {
  return dtos(double(val.r)) + ", " + dtos(double(val.g)) + ", " +
         dtos(double(val.b));
}